

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obs2icrs.cpp
# Opt level: O2

void PrintResults(CEExecOptions *inputs,CESkyCoord *results)

{
  double dVar1;
  CEAngle CStack_68;
  CEDate local_58;
  
  putchar(10);
  puts("******************************************");
  puts("* Results of Observed -> ICRS conversion *");
  puts("******************************************");
  puts("Observed Coordinates (input)");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"azimuth",(allocator *)&CStack_68);
  CLOptions::AsDouble(&inputs->super_CLOptions,(string *)&local_58);
  printf("    Azimuth        : %f degrees\n");
  std::__cxx11::string::~string((string *)&local_58);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&CStack_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"zenith",(allocator *)&CStack_68);
  CLOptions::AsDouble(&inputs->super_CLOptions,(string *)&local_58);
  printf("    Zenith         : %+f degrees\n");
  std::__cxx11::string::~string((string *)&local_58);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&CStack_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"zenith",(allocator *)&CStack_68);
  dVar1 = CLOptions::AsDouble(&inputs->super_CLOptions,(string *)&local_58);
  printf("    Altitude       : %+f degrees\n",90.0 - dVar1);
  std::__cxx11::string::~string((string *)&local_58);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&CStack_68);
  puts("ICRS Coordinates (output)");
  dVar1 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_58,dVar1,JD);
  (*results->_vptr_CESkyCoord[3])(&CStack_68,results,&local_58);
  CEAngle::Deg(&CStack_68);
  printf("    Right Ascension: %f degrees\n");
  CEAngle::~CEAngle(&CStack_68);
  CEDate::~CEDate(&local_58);
  dVar1 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_58,dVar1,JD);
  (*results->_vptr_CESkyCoord[4])(&CStack_68,results,&local_58);
  CEAngle::Deg(&CStack_68);
  printf("    Declination    : %+f degrees\n");
  CEAngle::~CEAngle(&CStack_68);
  CEDate::~CEDate(&local_58);
  puts("Observer Info");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"juliandate",(allocator *)&CStack_68);
  CLOptions::AsDouble(&inputs->super_CLOptions,(string *)&local_58);
  printf("    Julian Date    : %f\n");
  std::__cxx11::string::~string((string *)&local_58);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&CStack_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"longitude",(allocator *)&CStack_68);
  CLOptions::AsDouble(&inputs->super_CLOptions,(string *)&local_58);
  printf("    Longitude      : %f deg\n");
  std::__cxx11::string::~string((string *)&local_58);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&CStack_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"latitude",(allocator *)&CStack_68);
  CLOptions::AsDouble(&inputs->super_CLOptions,(string *)&local_58);
  printf("    Latitude       : %+f deg\n");
  std::__cxx11::string::~string((string *)&local_58);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&CStack_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"elevation",(allocator *)&CStack_68);
  CLOptions::AsDouble(&inputs->super_CLOptions,(string *)&local_58);
  printf("    Elevation      : %f meters\n");
  std::__cxx11::string::~string((string *)&local_58);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&CStack_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"pressure",(allocator *)&CStack_68);
  CLOptions::AsDouble(&inputs->super_CLOptions,(string *)&local_58);
  printf("    Pressure       : %f hPa\n");
  std::__cxx11::string::~string((string *)&local_58);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&CStack_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"temperature",(allocator *)&CStack_68);
  CLOptions::AsDouble(&inputs->super_CLOptions,(string *)&local_58);
  printf("    Temperature    : %f Celsius\n");
  std::__cxx11::string::~string((string *)&local_58);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&CStack_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"humidity",(allocator *)&CStack_68);
  CLOptions::AsDouble(&inputs->super_CLOptions,(string *)&local_58);
  printf("    Relative Humid.: %f\n");
  std::__cxx11::string::~string((string *)&local_58);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&CStack_68);
  putchar(10);
  return;
}

Assistant:

void PrintResults(CEExecOptions&    inputs, 
                  const CESkyCoord& results)
{
    std::printf("\n") ;
    std::printf("******************************************\n") ;
    std::printf("* Results of Observed -> ICRS conversion *\n") ;
    std::printf("******************************************\n") ;
    std::printf("Observed Coordinates (input)\n") ;
    std::printf("    Azimuth        : %f degrees\n", inputs.AsDouble("azimuth")) ;
    std::printf("    Zenith         : %+f degrees\n", inputs.AsDouble("zenith")) ;
    std::printf("    Altitude       : %+f degrees\n", 90.0-inputs.AsDouble("zenith")) ;
    std::printf("ICRS Coordinates (output)\n") ;
    std::printf("    Right Ascension: %f degrees\n", results.XCoord().Deg()) ;
    std::printf("    Declination    : %+f degrees\n", results.YCoord().Deg()) ;
    std::printf("Observer Info\n") ;
    std::printf("    Julian Date    : %f\n", inputs.AsDouble("juliandate")) ;
    std::printf("    Longitude      : %f deg\n", inputs.AsDouble("longitude")) ;
    std::printf("    Latitude       : %+f deg\n", inputs.AsDouble("latitude")) ;
    std::printf("    Elevation      : %f meters\n", inputs.AsDouble("elevation")) ;
    std::printf("    Pressure       : %f hPa\n", inputs.AsDouble("pressure")) ;
    std::printf("    Temperature    : %f Celsius\n", inputs.AsDouble("temperature")) ;
    std::printf("    Relative Humid.: %f\n", inputs.AsDouble("humidity")) ;
    std::printf("\n") ;
}